

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O1

void Gia_ManDumpTestsDelay(Vec_Int_t *vTests,int nIter,char *pFileName,Gia_Man_t *p)

{
  int iVar1;
  FILE *__stream;
  Vec_Int_t *p_00;
  int *piVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  
  __stream = fopen(pFileName,"wb");
  iVar7 = p->vCis->nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar7 - 1U) {
    iVar4 = iVar7;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar4;
  if (iVar4 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar4 << 2);
  }
  p_00->pArray = piVar2;
  iVar4 = vTests->nSize / nIter;
  if (vTests->nSize % nIter != 0) {
    __assert_fail("Vec_IntSize(vTests) % nIter == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                  ,0x3e0,"void Gia_ManDumpTestsDelay(Vec_Int_t *, int, char *, Gia_Man_t *)");
  }
  if (iVar4 != p->nRegs + (iVar7 - p->nRegs) * 2) {
    __assert_fail("nVars == 2 * Gia_ManPiNum(p) + Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                  ,0x3e1,"void Gia_ManDumpTestsDelay(Vec_Int_t *, int, char *, Gia_Man_t *)");
  }
  if (0 < nIter) {
    uVar3 = 0;
    uVar6 = 0;
    do {
      uVar5 = (ulong)uVar6;
      p_00->nSize = 0;
      iVar7 = p->nRegs;
      if (iVar7 < p->vCis->nSize) {
        iVar1 = iVar7 + uVar6;
        do {
          if ((iVar1 < 0) || (uVar9 = iVar7 + uVar6, vTests->nSize <= (int)uVar9))
          goto LAB_0058ebf0;
          fprintf(__stream,"%d",(ulong)(uint)vTests->pArray[uVar9]);
          if (vTests->nSize <= (int)uVar9) goto LAB_0058ebf0;
          Vec_IntPush(p_00,vTests->pArray[uVar9]);
          iVar7 = iVar7 + 1;
        } while (iVar7 < p->vCis->nSize);
      }
      if (0 < p->nRegs) {
        lVar8 = 0;
        do {
          if (((int)uVar6 < 0) || (vTests->nSize <= (int)uVar5)) goto LAB_0058ebf0;
          fprintf(__stream,"%d",(ulong)(uint)vTests->pArray[uVar5]);
          if (vTests->nSize <= (int)uVar5) goto LAB_0058ebf0;
          Vec_IntPush(p_00,vTests->pArray[uVar5]);
          lVar8 = lVar8 + 1;
          uVar5 = uVar5 + 1;
        } while (lVar8 < p->nRegs);
      }
      fputc(10,__stream);
      Gia_ManDumpTestsSimulate(p,p_00);
      iVar7 = p->vCis->nSize;
      if (iVar7 < iVar4) {
        iVar1 = iVar7 + uVar6;
        do {
          if ((iVar1 < 0) || (vTests->nSize <= (int)(iVar7 + uVar6))) {
LAB_0058ebf0:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          fprintf(__stream,"%d",(ulong)(uint)vTests->pArray[iVar7 + uVar6]);
          iVar7 = iVar7 + 1;
        } while (iVar4 != iVar7);
      }
      iVar7 = p_00->nSize;
      if (0 < (long)iVar7) {
        piVar2 = p_00->pArray;
        lVar8 = 0;
        do {
          fprintf(__stream,"%d",(ulong)(uint)piVar2[lVar8]);
          lVar8 = lVar8 + 1;
        } while (iVar7 != lVar8);
      }
      fputc(10,__stream);
      uVar3 = uVar3 + 1;
      uVar6 = uVar6 + iVar4;
    } while (uVar3 != (uint)nIter);
  }
  Gia_ManCleanMark0(p);
  fclose(__stream);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  return;
}

Assistant:

void Gia_ManDumpTestsDelay( Vec_Int_t * vTests, int nIter, char * pFileName, Gia_Man_t * p )
{
    FILE * pFile = fopen( pFileName, "wb" );
    Vec_Int_t * vValues = Vec_IntAlloc( Gia_ManCiNum(p) );
    int i, v, nVars = Vec_IntSize(vTests) / nIter;
    assert( Vec_IntSize(vTests) % nIter == 0 );
    assert( nVars == 2 * Gia_ManPiNum(p) + Gia_ManRegNum(p) );
    for ( i = 0; i < nIter; i++ )
    {
        // collect PIs followed by flops
        Vec_IntClear( vValues );
        for ( v = Gia_ManRegNum(p); v < Gia_ManCiNum(p); v++ )
        {
            fprintf( pFile, "%d", Vec_IntEntry(vTests, i * nVars + v) );
            Vec_IntPush( vValues, Vec_IntEntry(vTests, i * nVars + v) );
        }
        for ( v = 0; v < Gia_ManRegNum(p); v++ )
        {
            fprintf( pFile, "%d", Vec_IntEntry(vTests, i * nVars + v) );
            Vec_IntPush( vValues, Vec_IntEntry(vTests, i * nVars + v) );
        }
        fprintf( pFile, "\n" );
        // derive next-state values
        Gia_ManDumpTestsSimulate( p, vValues );
        // collect PIs followed by flops
        for ( v = Gia_ManCiNum(p); v < nVars; v++ )
            fprintf( pFile, "%d", Vec_IntEntry(vTests, i * nVars + v) );
        for ( v = 0; v < Vec_IntSize(vValues); v++ )
            fprintf( pFile, "%d", Vec_IntEntry(vValues, v) );
        fprintf( pFile, "\n" );
    }
    Gia_ManCleanMark0(p);
    fclose( pFile );
    Vec_IntFree( vValues );
}